

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O2

void __thiscall
deqp::gls::VarSpec::VarSpec<tcu::Matrix<float,3,3>>
          (VarSpec *this,string *name_,Matrix<float,_3,_3> *minValue_,Matrix<float,_3,_3> *maxValue_
          )

{
  std::__cxx11::string::string((string *)this,(string *)name_);
  set<3,3>(this,minValue_,maxValue_);
  return;
}

Assistant:

VarSpec (const std::string& name_, const T& minValue_, const T& maxValue_)	: name(name_) { set(minValue_, maxValue_); }